

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_proxy_io.c
# Opt level: O2

OPTIONHANDLER_HANDLE http_proxy_io_retrieve_options(CONCRETE_IO_HANDLE http_proxy_io)

{
  OPTIONHANDLER_RESULT OVar1;
  OPTIONHANDLER_HANDLE handle;
  OPTIONHANDLER_HANDLE handle_00;
  LOGGER_LOG p_Var2;
  int iVar3;
  char *pcVar4;
  
  if (http_proxy_io == (CONCRETE_IO_HANDLE)0x0) {
    p_Var2 = xlogging_get_log_function();
    if (p_Var2 != (LOGGER_LOG)0x0) {
      pcVar4 = "invalid parameter detected: CONCRETE_IO_HANDLE handle=%p";
      iVar3 = 0x3f6;
LAB_001097ff:
      (*p_Var2)(AZ_LOG_ERROR,
                "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/http_proxy_io.c"
                ,"http_proxy_io_retrieve_options",iVar3,1,pcVar4);
      return (OPTIONHANDLER_HANDLE)0x0;
    }
  }
  else {
    handle = OptionHandler_Create
                       (http_proxy_io_clone_option,http_proxy_io_destroy_option,
                        http_proxy_io_set_option);
    if (handle == (OPTIONHANDLER_HANDLE)0x0) {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        pcVar4 = "OptionHandler_Create failed";
        iVar3 = 0x401;
        goto LAB_001097ff;
      }
    }
    else {
      handle_00 = xio_retrieveoptions(*(XIO_HANDLE *)((long)http_proxy_io + 0x78));
      if (handle_00 != (OPTIONHANDLER_HANDLE)0x0) {
        OVar1 = OptionHandler_AddOption(handle,"underlying_io_options",handle_00);
        if (OVar1 != OPTIONHANDLER_OK) {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 != (LOGGER_LOG)0x0) {
            (*p_Var2)(AZ_LOG_ERROR,
                      "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/http_proxy_io.c"
                      ,"http_proxy_io_retrieve_options",0x414,1,
                      "unable to save underlying_io options");
          }
          OptionHandler_Destroy(handle);
          handle = (OPTIONHANDLER_HANDLE)0x0;
        }
        OptionHandler_Destroy(handle_00);
        return handle;
      }
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 != (LOGGER_LOG)0x0) {
        (*p_Var2)(AZ_LOG_ERROR,
                  "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/src/http_proxy_io.c"
                  ,"http_proxy_io_retrieve_options",0x40b,1,
                  "unable to retrieve underlying_io options");
      }
      OptionHandler_Destroy(handle);
    }
  }
  return (OPTIONHANDLER_HANDLE)0x0;
}

Assistant:

static OPTIONHANDLER_HANDLE http_proxy_io_retrieve_options(CONCRETE_IO_HANDLE http_proxy_io)
{
    OPTIONHANDLER_HANDLE result;

    if (http_proxy_io == NULL)
    {
        /* Codes_SRS_HTTP_PROXY_IO_01_047: [ If the parameter http_proxy_io is NULL then http_proxy_io_retrieve_options shall fail and return NULL. ]*/
        LogError("invalid parameter detected: CONCRETE_IO_HANDLE handle=%p", http_proxy_io);
        result = NULL;
    }
    else
    {
        HTTP_PROXY_IO_INSTANCE* http_proxy_io_instance = (HTTP_PROXY_IO_INSTANCE*)http_proxy_io;

        result = OptionHandler_Create(http_proxy_io_clone_option, http_proxy_io_destroy_option, http_proxy_io_set_option);

        if (result == NULL)
        {
            LogError("OptionHandler_Create failed");
        }
        else
        {
            OPTIONHANDLER_HANDLE underlying_io_options;

            /* Codes_SRS_HTTP_PROXY_IO_01_046: [ http_proxy_io_retrieve_options shall return an OPTIONHANDLER_HANDLE obtained by calling xio_retrieveoptions on the underlying IO created in http_proxy_io_create. ]*/
            if ((underlying_io_options = xio_retrieveoptions(http_proxy_io_instance->underlying_io)) == NULL)
            {
                /* Codes_SRS_HTTP_PROXY_IO_01_048: [ If xio_retrieveoptions fails, http_proxy_io_retrieve_options shall return NULL. ]*/
                LogError("unable to retrieve underlying_io options");  
                OptionHandler_Destroy(result);
                result = NULL;
            }
            else 
            {
                if (OptionHandler_AddOption(result, OPTION_UNDERLYING_IO_OPTIONS, underlying_io_options) != OPTIONHANDLER_OK)
                {
                    /* Codes_SRS_HTTP_PROXY_IO_01_048: [ If xio_retrieveoptions fails, http_proxy_io_retrieve_options shall return NULL. ]*/
                    LogError("unable to save underlying_io options");
                    OptionHandler_Destroy(result);
                    result = NULL;
                }
                else
                {
                    // All is fine. 
                }

                // Must destroy since OptionHandler_AddOption creates a copy of it.
                OptionHandler_Destroy(underlying_io_options);
            }
        }
    }
    return result;
}